

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXMaterial.cpp
# Opt level: O3

void __thiscall
Assimp::FBX::Texture::Texture(Texture *this,uint64_t id,Element *element,Document *doc,string *name)

{
  PropertyTable *pPVar1;
  bool bVar2;
  pointer ppCVar3;
  pointer ppCVar4;
  uint uVar5;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>_>
  *this_00;
  const_iterator cVar6;
  Token *pTVar7;
  Property *pPVar8;
  long lVar9;
  Object *pOVar10;
  Video *pVVar11;
  Token *t;
  Token *t_00;
  Token *t_01;
  Token *t_02;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  Element *el;
  Element *el_00;
  _Rb_tree_header *p_Var13;
  Element *el_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var14;
  float fVar15;
  key_type local_e8;
  aiVector2D local_c8;
  undefined8 uStack_c0;
  vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_> local_b8
  ;
  string *local_98;
  string *local_90;
  string *local_88;
  string *local_80;
  Element *local_78;
  Element *local_70;
  Element *local_68;
  Document *local_60;
  Element *local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  local_60 = doc;
  Object::Object(&this->super_Object,id,element,name);
  (this->super_Object)._vptr_Object = (_func_int **)&PTR__Texture_009a61b0;
  (this->uvTrans).x = 0.0;
  (this->uvTrans).y = 0.0;
  (this->uvScaling).x = 1.0;
  (this->uvScaling).y = 1.0;
  local_80 = (string *)&this->type;
  local_38 = &(this->type).field_2;
  (this->type)._M_dataplus._M_p = (pointer)local_38;
  (this->type)._M_string_length = 0;
  (this->type).field_2._M_local_buf[0] = '\0';
  local_90 = (string *)&this->relativeFileName;
  local_40 = &(this->relativeFileName).field_2;
  (this->relativeFileName)._M_dataplus._M_p = (pointer)local_40;
  (this->relativeFileName)._M_string_length = 0;
  (this->relativeFileName).field_2._M_local_buf[0] = '\0';
  local_88 = (string *)&this->fileName;
  local_48 = &(this->fileName).field_2;
  (this->fileName)._M_dataplus._M_p = (pointer)local_48;
  (this->fileName)._M_string_length = 0;
  (this->fileName).field_2._M_local_buf[0] = '\0';
  local_98 = (string *)&this->alphaSource;
  local_50 = &(this->alphaSource).field_2;
  (this->alphaSource)._M_dataplus._M_p = (pointer)local_50;
  (this->alphaSource)._M_string_length = 0;
  (this->alphaSource).field_2._M_local_buf[0] = '\0';
  (this->props).super___shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->props).super___shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->media = (Video *)0x0;
  local_58 = element;
  this_00 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>_>
             *)GetRequiredScope(element);
  paVar12 = &local_e8.field_2;
  local_e8._M_dataplus._M_p = (pointer)paVar12;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"Type","");
  cVar6 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>_>
          ::find(this_00,&local_e8);
  p_Var13 = &(this_00->_M_impl).super__Rb_tree_header;
  if ((_Rb_tree_header *)cVar6._M_node == p_Var13) {
    local_c8 = (aiVector2D)0x0;
  }
  else {
    local_c8 = *(aiVector2D *)(cVar6._M_node + 2);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != paVar12) {
    operator_delete(local_e8._M_dataplus._M_p);
  }
  local_e8._M_dataplus._M_p = (pointer)paVar12;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"FileName","");
  cVar6 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>_>
          ::find(this_00,&local_e8);
  if ((_Rb_tree_header *)cVar6._M_node == p_Var13) {
    local_68 = (Element *)0x0;
  }
  else {
    local_68 = *(Element **)(cVar6._M_node + 2);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != paVar12) {
    operator_delete(local_e8._M_dataplus._M_p);
  }
  local_e8._M_dataplus._M_p = (pointer)paVar12;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"RelativeFilename","");
  cVar6 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>_>
          ::find(this_00,&local_e8);
  if ((_Rb_tree_header *)cVar6._M_node == p_Var13) {
    local_70 = (Element *)0x0;
  }
  else {
    local_70 = *(Element **)(cVar6._M_node + 2);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != paVar12) {
    operator_delete(local_e8._M_dataplus._M_p);
  }
  local_e8._M_dataplus._M_p = (pointer)paVar12;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"ModelUVTranslation","");
  cVar6 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>_>
          ::find(this_00,&local_e8);
  if ((_Rb_tree_header *)cVar6._M_node == p_Var13) {
    el = (Element *)0x0;
  }
  else {
    el = *(Element **)(cVar6._M_node + 2);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != paVar12) {
    operator_delete(local_e8._M_dataplus._M_p);
  }
  local_e8._M_dataplus._M_p = (pointer)paVar12;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"ModelUVScaling","");
  cVar6 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>_>
          ::find(this_00,&local_e8);
  if ((_Rb_tree_header *)cVar6._M_node == p_Var13) {
    el_00 = (Element *)0x0;
  }
  else {
    el_00 = *(Element **)(cVar6._M_node + 2);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != paVar12) {
    operator_delete(local_e8._M_dataplus._M_p);
  }
  local_e8._M_dataplus._M_p = (pointer)paVar12;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"Texture_Alpha_Source","");
  cVar6 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>_>
          ::find(this_00,&local_e8);
  if ((_Rb_tree_header *)cVar6._M_node == p_Var13) {
    local_78 = (Element *)0x0;
  }
  else {
    local_78 = *(Element **)(cVar6._M_node + 2);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != paVar12) {
    operator_delete(local_e8._M_dataplus._M_p);
  }
  local_e8._M_dataplus._M_p = (pointer)paVar12;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"Cropping","");
  cVar6 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>_>
          ::find(this_00,&local_e8);
  if ((_Rb_tree_header *)cVar6._M_node == p_Var13) {
    el_01 = (Element *)0x0;
  }
  else {
    el_01 = *(Element **)(cVar6._M_node + 2);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != paVar12) {
    operator_delete(local_e8._M_dataplus._M_p);
  }
  if (local_c8 != (aiVector2D)0x0) {
    pTVar7 = GetRequiredToken((Element *)local_c8,0);
    ParseTokenAsString_abi_cxx11_(&local_e8,(FBX *)pTVar7,t);
    std::__cxx11::string::operator=(local_80,(string *)&local_e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p);
    }
  }
  if (local_68 != (Element *)0x0) {
    pTVar7 = GetRequiredToken(local_68,0);
    ParseTokenAsString_abi_cxx11_(&local_e8,(FBX *)pTVar7,t_00);
    std::__cxx11::string::operator=(local_88,(string *)&local_e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p);
    }
  }
  if (local_70 != (Element *)0x0) {
    pTVar7 = GetRequiredToken(local_70,0);
    ParseTokenAsString_abi_cxx11_(&local_e8,(FBX *)pTVar7,t_01);
    std::__cxx11::string::operator=(local_90,(string *)&local_e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p);
    }
  }
  paVar12 = &local_e8.field_2;
  if (el != (Element *)0x0) {
    pTVar7 = GetRequiredToken(el,0);
    fVar15 = ParseTokenAsFloat(pTVar7);
    local_c8.x = fVar15;
    pTVar7 = GetRequiredToken(el,1);
    fVar15 = ParseTokenAsFloat(pTVar7);
    (this->uvTrans).x = local_c8.x;
    (this->uvTrans).y = fVar15;
  }
  if (el_00 != (Element *)0x0) {
    pTVar7 = GetRequiredToken(el_00,0);
    fVar15 = ParseTokenAsFloat(pTVar7);
    local_c8.x = fVar15;
    pTVar7 = GetRequiredToken(el_00,1);
    fVar15 = ParseTokenAsFloat(pTVar7);
    (this->uvScaling).x = local_c8.x;
    (this->uvScaling).y = fVar15;
  }
  if (el_01 == (Element *)0x0) {
    this->crop[0] = 0;
    this->crop[1] = 0;
    this->crop[2] = 0;
    this->crop[3] = 0;
  }
  else {
    pTVar7 = GetRequiredToken(el_01,0);
    uVar5 = ParseTokenAsInt(pTVar7);
    this->crop[0] = uVar5;
    pTVar7 = GetRequiredToken(el_01,1);
    uVar5 = ParseTokenAsInt(pTVar7);
    this->crop[1] = uVar5;
    pTVar7 = GetRequiredToken(el_01,2);
    uVar5 = ParseTokenAsInt(pTVar7);
    this->crop[2] = uVar5;
    pTVar7 = GetRequiredToken(el_01,3);
    uVar5 = ParseTokenAsInt(pTVar7);
    this->crop[3] = uVar5;
  }
  if (local_78 != (Element *)0x0) {
    pTVar7 = GetRequiredToken(local_78,0);
    ParseTokenAsString_abi_cxx11_(&local_e8,(FBX *)pTVar7,t_02);
    std::__cxx11::string::operator=(local_98,(string *)&local_e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != paVar12) {
      operator_delete(local_e8._M_dataplus._M_p);
    }
  }
  local_e8._M_dataplus._M_p = (pointer)paVar12;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"Texture.FbxFileTexture","");
  Util::GetPropertyTable((Util *)&local_b8,local_60,&local_e8,local_58,(Scope *)this_00,false);
  ppCVar4 = local_b8.
            super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  ppCVar3 = local_b8.
            super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_b8.
  super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.
  super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  p_Var14 = (this->props).
            super___shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (this->props).super___shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)ppCVar3;
  (this->props).super___shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ppCVar4;
  if ((p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
     (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var14),
     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
     local_b8.
     super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
     ._M_impl.super__Vector_impl_data._M_finish !=
     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_b8.
               super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != paVar12) {
    operator_delete(local_e8._M_dataplus._M_p);
  }
  pPVar1 = (this->props).
           super___shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_e8._M_dataplus._M_p = (pointer)paVar12;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"Scaling","");
  pPVar8 = PropertyTable::Get(pPVar1,&local_e8);
  local_c8.x = 0.0;
  local_c8.y = 0.0;
  uStack_c0 = 0;
  if (pPVar8 == (Property *)0x0) {
    bVar2 = false;
  }
  else {
    bVar2 = false;
    lVar9 = __dynamic_cast(pPVar8,&Property::typeinfo,&TypedProperty<aiVector3t<float>>::typeinfo,0)
    ;
    if (lVar9 != 0) {
      local_c8 = *(aiVector2D *)(lVar9 + 8);
      uStack_c0 = 0;
      bVar2 = true;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != paVar12) {
    operator_delete(local_e8._M_dataplus._M_p);
  }
  if (bVar2) {
    (this->uvScaling).x = local_c8.x;
    (this->uvScaling).y = local_c8.y;
  }
  pPVar1 = (this->props).
           super___shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_e8._M_dataplus._M_p = (pointer)paVar12;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"Translation","");
  pPVar8 = PropertyTable::Get(pPVar1,&local_e8);
  local_c8.x = 0.0;
  local_c8.y = 0.0;
  uStack_c0 = 0;
  if (pPVar8 == (Property *)0x0) {
    bVar2 = false;
  }
  else {
    bVar2 = false;
    lVar9 = __dynamic_cast(pPVar8,&Property::typeinfo,&TypedProperty<aiVector3t<float>>::typeinfo,0)
    ;
    if (lVar9 != 0) {
      local_c8 = *(aiVector2D *)(lVar9 + 8);
      uStack_c0 = 0;
      bVar2 = true;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != paVar12) {
    operator_delete(local_e8._M_dataplus._M_p);
  }
  if (bVar2) {
    this->uvTrans = local_c8;
  }
  if (local_60->settings->readTextures == true) {
    Document::GetConnectionsByDestinationSequenced(&local_b8,local_60,(this->super_Object).id);
    ppCVar3 = local_b8.
              super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (p_Var14 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_b8.
                   super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ppCVar3;
        p_Var14 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&p_Var14->_M_use_count) {
      pOVar10 = Connection::SourceObject((Connection *)p_Var14->_vptr__Sp_counted_base);
      if (pOVar10 == (Object *)0x0) {
        local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_e8,"failed to read source object for texture link, ignoring","")
        ;
        Util::DOMWarning(&local_e8,local_58);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p);
        }
      }
      else {
        pVVar11 = (Video *)__dynamic_cast(pOVar10,&Object::typeinfo,&Video::typeinfo,0);
        if (pVVar11 != (Video *)0x0) {
          this->media = pVVar11;
        }
      }
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_b8.
        super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      operator_delete(local_b8.
                      super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

Texture::Texture(uint64_t id, const Element& element, const Document& doc, const std::string& name)
: Object(id,element,name)
, uvScaling(1.0f,1.0f)
, media(0)
{
    const Scope& sc = GetRequiredScope(element);

    const Element* const Type = sc["Type"];
    const Element* const FileName = sc["FileName"];
    const Element* const RelativeFilename = sc["RelativeFilename"];
    const Element* const ModelUVTranslation = sc["ModelUVTranslation"];
    const Element* const ModelUVScaling = sc["ModelUVScaling"];
    const Element* const Texture_Alpha_Source = sc["Texture_Alpha_Source"];
    const Element* const Cropping = sc["Cropping"];

    if(Type) {
        type = ParseTokenAsString(GetRequiredToken(*Type,0));
    }

    if(FileName) {
        fileName = ParseTokenAsString(GetRequiredToken(*FileName,0));
    }

    if(RelativeFilename) {
        relativeFileName = ParseTokenAsString(GetRequiredToken(*RelativeFilename,0));
    }

    if(ModelUVTranslation) {
        uvTrans = aiVector2D(ParseTokenAsFloat(GetRequiredToken(*ModelUVTranslation,0)),
            ParseTokenAsFloat(GetRequiredToken(*ModelUVTranslation,1))
        );
    }

    if(ModelUVScaling) {
        uvScaling = aiVector2D(ParseTokenAsFloat(GetRequiredToken(*ModelUVScaling,0)),
            ParseTokenAsFloat(GetRequiredToken(*ModelUVScaling,1))
        );
    }

    if(Cropping) {
        crop[0] = ParseTokenAsInt(GetRequiredToken(*Cropping,0));
        crop[1] = ParseTokenAsInt(GetRequiredToken(*Cropping,1));
        crop[2] = ParseTokenAsInt(GetRequiredToken(*Cropping,2));
        crop[3] = ParseTokenAsInt(GetRequiredToken(*Cropping,3));
    }
    else {
        // vc8 doesn't support the crop() syntax in initialization lists
        // (and vc9 WARNS about the new (i.e. compliant) behaviour).
        crop[0] = crop[1] = crop[2] = crop[3] = 0;
    }

    if(Texture_Alpha_Source) {
        alphaSource = ParseTokenAsString(GetRequiredToken(*Texture_Alpha_Source,0));
    }

    props = GetPropertyTable(doc,"Texture.FbxFileTexture",element,sc);

    // 3DS Max and FBX SDK use "Scaling" and "Translation" instead of "ModelUVScaling" and "ModelUVTranslation". Use these properties if available.
    bool ok;
    const aiVector3D& scaling = PropertyGet<aiVector3D>(*props, "Scaling", ok);
    if (ok) {
        uvScaling.x = scaling.x;
        uvScaling.y = scaling.y;
    }

    const aiVector3D& trans = PropertyGet<aiVector3D>(*props, "Translation", ok);
    if (ok) {
        uvTrans.x = trans.x;
        uvTrans.y = trans.y;
    }

    // resolve video links
    if(doc.Settings().readTextures) {
        const std::vector<const Connection*>& conns = doc.GetConnectionsByDestinationSequenced(ID());
        for(const Connection* con : conns) {
            const Object* const ob = con->SourceObject();
            if(!ob) {
                DOMWarning("failed to read source object for texture link, ignoring",&element);
                continue;
            }

            const Video* const video = dynamic_cast<const Video*>(ob);
            if(video) {
                media = video;
            }
        }
    }
}